

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_encoder.cc
# Opt level: O0

Status * __thiscall draco::MeshSequentialEncoder::EncodeConnectivity(MeshSequentialEncoder *this)

{
  byte bVar1;
  bool bVar2;
  ValueType VVar3;
  uint uVar4;
  Mesh *pMVar5;
  EncoderBuffer *data;
  const_reference pvVar6;
  MeshEncoder *in_RSI;
  Status *in_RDI;
  Face *face_3;
  FaceIndex i_3;
  Face *face_2;
  FaceIndex i_2;
  Face *face_1;
  FaceIndex i_1;
  Face *face;
  FaceIndex i;
  uint32_t num_faces;
  undefined4 in_stack_fffffffffffffeb8;
  Code in_stack_fffffffffffffebc;
  uint in_stack_fffffffffffffec0;
  FaceIndex in_stack_fffffffffffffec4;
  array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *in_stack_fffffffffffffee0
  ;
  EncoderBuffer *in_stack_fffffffffffffee8;
  allocator<char> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  allocator<char> *__s;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_b8;
  uint local_b4;
  Face *local_b0;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_a8;
  undefined2 local_a2;
  undefined2 in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff62;
  undefined4 in_stack_ffffffffffffff64;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_8c;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  uint local_84;
  Face *local_80;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_78;
  undefined1 local_72;
  allocator<char> local_71;
  string local_70 [35];
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38 [36];
  ValueType local_14 [5];
  
  MeshEncoder::mesh(in_RSI);
  local_14[0] = Mesh::num_faces((Mesh *)0x1ab77e);
  PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
  EncodeVarint<unsigned_int>
            (in_stack_fffffffffffffec0,
             (EncoderBuffer *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  pMVar5 = MeshEncoder::mesh(in_RSI);
  PointCloud::num_points(&pMVar5->super_PointCloud);
  PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
  EncodeVarint<unsigned_int>
            (in_stack_fffffffffffffec0,
             (EncoderBuffer *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  PointCloudEncoder::options(&in_RSI->super_PointCloudEncoder);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
             ,in_stack_fffffffffffffef0);
  bVar1 = DracoOptions<int>::GetGlobalBool
                    ((DracoOptions<int> *)
                     CONCAT44(in_stack_fffffffffffffec4.value_,in_stack_fffffffffffffec0),
                     (string *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),false);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  if ((bVar1 & 1) == 0) {
    PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
    local_72 = 1;
    EncoderBuffer::Encode<unsigned_char>
              (in_stack_fffffffffffffee8,(uchar *)in_stack_fffffffffffffee0);
    pMVar5 = MeshEncoder::mesh(in_RSI);
    VVar3 = PointCloud::num_points(&pMVar5->super_PointCloud);
    if (VVar3 < 0x100) {
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_78,0);
      while (bVar2 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<
                               (&local_78,local_14), bVar2) {
        MeshEncoder::mesh(in_RSI);
        local_84 = local_78.value_;
        local_80 = Mesh::face((Mesh *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                              in_stack_fffffffffffffec4);
        data = PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
        pvVar6 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                 operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                             *)CONCAT44(in_stack_fffffffffffffec4.value_,in_stack_fffffffffffffec0),
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        uVar4 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(pvVar6);
        local_85 = (undefined1)uVar4;
        EncoderBuffer::Encode<unsigned_char>(in_stack_fffffffffffffee8,(uchar *)data);
        in_stack_fffffffffffffee8 = PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
        pvVar6 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                 operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                             *)CONCAT44(in_stack_fffffffffffffec4.value_,in_stack_fffffffffffffec0),
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        uVar4 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(pvVar6);
        local_86 = (undefined1)uVar4;
        EncoderBuffer::Encode<unsigned_char>(in_stack_fffffffffffffee8,(uchar *)data);
        PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
        pvVar6 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                 operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                             *)CONCAT44(in_stack_fffffffffffffec4.value_,in_stack_fffffffffffffec0),
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        uVar4 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(pvVar6);
        local_87 = (undefined1)uVar4;
        EncoderBuffer::Encode<unsigned_char>(in_stack_fffffffffffffee8,(uchar *)data);
        IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_78);
      }
    }
    else {
      pMVar5 = MeshEncoder::mesh(in_RSI);
      VVar3 = PointCloud::num_points(&pMVar5->super_PointCloud);
      if (VVar3 < 0x10000) {
        IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_8c,0);
        while (bVar2 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<
                                 (&local_8c,local_14), bVar2) {
          MeshEncoder::mesh(in_RSI);
          Mesh::face((Mesh *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     in_stack_fffffffffffffec4);
          PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
          pvVar6 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                   operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                               *)CONCAT44(in_stack_fffffffffffffec4.value_,in_stack_fffffffffffffec0
                                         ),
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(pvVar6);
          EncoderBuffer::Encode<unsigned_short>
                    (in_stack_fffffffffffffee8,(unsigned_short *)in_stack_fffffffffffffee0);
          PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
          pvVar6 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                   operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                               *)CONCAT44(in_stack_fffffffffffffec4.value_,in_stack_fffffffffffffec0
                                         ),
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(pvVar6);
          EncoderBuffer::Encode<unsigned_short>
                    (in_stack_fffffffffffffee8,(unsigned_short *)in_stack_fffffffffffffee0);
          PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
          pvVar6 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                   operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                               *)CONCAT44(in_stack_fffffffffffffec4.value_,in_stack_fffffffffffffec0
                                         ),
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          uVar4 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(pvVar6);
          local_a2 = (undefined2)uVar4;
          EncoderBuffer::Encode<unsigned_short>
                    (in_stack_fffffffffffffee8,(unsigned_short *)in_stack_fffffffffffffee0);
          IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_8c);
        }
      }
      else {
        pMVar5 = MeshEncoder::mesh(in_RSI);
        VVar3 = PointCloud::num_points(&pMVar5->super_PointCloud);
        if (VVar3 < 0x200000) {
          IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_a8,0);
          while (bVar2 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<
                                   (&local_a8,local_14), bVar2) {
            MeshEncoder::mesh(in_RSI);
            local_b4 = local_a8.value_;
            local_b0 = Mesh::face((Mesh *)CONCAT44(in_stack_fffffffffffffebc,
                                                   in_stack_fffffffffffffeb8),
                                  in_stack_fffffffffffffec4);
            pvVar6 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                     operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                 *)CONCAT44(in_stack_fffffffffffffec4.value_,
                                            in_stack_fffffffffffffec0),
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            in_stack_fffffffffffffebc =
                 IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(pvVar6);
            PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
            EncodeVarint<unsigned_int>
                      (in_stack_fffffffffffffec0,
                       (EncoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            pvVar6 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                     operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                 *)CONCAT44(in_stack_fffffffffffffec4.value_,
                                            in_stack_fffffffffffffec0),
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            in_stack_fffffffffffffec0 =
                 IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(pvVar6);
            PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
            EncodeVarint<unsigned_int>
                      (in_stack_fffffffffffffec0,
                       (EncoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            pvVar6 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                     operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                                 *)CONCAT44(in_stack_fffffffffffffec4.value_,
                                            in_stack_fffffffffffffec0),
                                CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            in_stack_fffffffffffffec4.value_ =
                 IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(pvVar6);
            PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
            EncodeVarint<unsigned_int>
                      (in_stack_fffffffffffffec0,
                       (EncoderBuffer *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_a8);
          }
        }
        else {
          IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_b8,0);
          while (bVar2 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<
                                   (&local_b8,local_14), bVar2) {
            MeshEncoder::mesh(in_RSI);
            Mesh::face((Mesh *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                       in_stack_fffffffffffffec4);
            PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
            EncoderBuffer::
            Encode<std::array<draco::IndexType<unsigned_int,draco::PointIndex_tag_type_>,3ul>>
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_b8);
          }
        }
      }
    }
  }
  else {
    PointCloudEncoder::buffer(&in_RSI->super_PointCloudEncoder);
    local_4d = 0;
    EncoderBuffer::Encode<unsigned_char>
              (in_stack_fffffffffffffee8,(uchar *)in_stack_fffffffffffffee0);
    bVar2 = CompressAndEncodeIndices
                      ((MeshSequentialEncoder *)
                       CONCAT44(in_stack_ffffffffffffff64,
                                CONCAT22(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60)));
    if (!bVar2) {
      __s = &local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,in_stack_ffffffffffffff00),(char *)__s,in_stack_fffffffffffffef0);
      Status::Status((Status *)CONCAT44(in_stack_fffffffffffffec4.value_,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffebc,(string *)0x1ab8c7);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator(&local_71);
      return in_RDI;
    }
  }
  OkStatus();
  return in_RDI;
}

Assistant:

Status MeshSequentialEncoder::EncodeConnectivity() {
  // Serialize indices.
  const uint32_t num_faces = mesh()->num_faces();
  EncodeVarint(num_faces, buffer());
  EncodeVarint(static_cast<uint32_t>(mesh()->num_points()), buffer());

  // We encode all attributes in the original (possibly duplicated) format.
  if (options()->GetGlobalBool("compress_connectivity", false)) {
    // 0 = Encode compressed indices.
    buffer()->Encode(static_cast<uint8_t>(0));
    if (!CompressAndEncodeIndices()) {
      return Status(Status::DRACO_ERROR, "Failed to compress connectivity.");
    }
  } else {
    // 1 = Encode indices directly.
    buffer()->Encode(static_cast<uint8_t>(1));
    // Store vertex indices using a smallest data type that fits their range.
    if (mesh()->num_points() < 256) {
      // Serialize indices as uint8_t.
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        buffer()->Encode(static_cast<uint8_t>(face[0].value()));
        buffer()->Encode(static_cast<uint8_t>(face[1].value()));
        buffer()->Encode(static_cast<uint8_t>(face[2].value()));
      }
    } else if (mesh()->num_points() < (1 << 16)) {
      // Serialize indices as uint16_t.
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        buffer()->Encode(static_cast<uint16_t>(face[0].value()));
        buffer()->Encode(static_cast<uint16_t>(face[1].value()));
        buffer()->Encode(static_cast<uint16_t>(face[2].value()));
      }
    } else if (mesh()->num_points() < (1 << 21)) {
      // Serialize indices as varint.
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        EncodeVarint(static_cast<uint32_t>(face[0].value()), buffer());
        EncodeVarint(static_cast<uint32_t>(face[1].value()), buffer());
        EncodeVarint(static_cast<uint32_t>(face[2].value()), buffer());
      }
    } else {
      // Serialize faces as uint32_t (default).
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        buffer()->Encode(face);
      }
    }
  }
  return OkStatus();
}